

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiQuery.cpp
# Opt level: O2

void __thiscall
MultiQuery<dto::Complex,_dto::Complex>::on_input
          (MultiQuery<dto::Complex,_dto::Complex> *this,Poll *p)

{
  ushort uVar1;
  ssize_t sVar2;
  ostream *poVar3;
  char *pcVar4;
  Error *this_00;
  socklen_t remln;
  Complex dto;
  string data;
  socklen_t local_cc;
  undefined1 local_c8 [32];
  _Alloc_hider local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  string local_80;
  undefined1 local_60 [64];
  
  local_cc = 0x10;
  sVar2 = recvfrom((this->super_Subscriber).fd,buffer_abi_cxx11_._M_dataplus._M_p,
                   buffer_abi_cxx11_._M_string_length,0,(sockaddr *)&this->remote,&local_cc);
  if (-1 < (int)sVar2) {
    std::__cxx11::string::substr((ulong)&local_80,0x159550);
    local_a8._M_p = (pointer)&local_98;
    local_c8._16_2_ = 0;
    local_c8._18_8_ = 0;
    local_c8[0] = '\0';
    local_c8[1] = '\0';
    local_c8[2] = '\0';
    local_c8[3] = '\0';
    local_c8[4] = '\0';
    local_c8[5] = '\0';
    local_c8[6] = '\0';
    local_c8[7] = '\0';
    local_c8[8] = '\0';
    local_c8[9] = '\0';
    local_c8._10_6_ = 0;
    local_a0 = 0;
    local_98._M_local_buf[0] = '\0';
    ::dto::unmarshall_facade<dto::Complex>((Complex *)local_60,&local_80);
    ::dto::Complex::operator=((Complex *)local_c8,(Complex *)local_60);
    std::__cxx11::string::~string((string *)(local_60 + 0x20));
    poVar3 = std::operator<<((ostream *)&std::cout,"MultiQuery: received ");
    poVar3 = operator<<(poVar3,(Complex *)local_c8);
    std::endl<char,std::char_traits<char>>(poVar3);
    if (CONCAT26(local_c8._16_2_,local_c8._10_6_) == (this->req).header.cmd_seq) {
      if ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::function<void_(dto::Complex_&,_sockaddr_in)>::operator()
                  (&this->callback,(Complex *)local_c8,this->remote);
      }
    }
    else {
      pcVar4 = inet_ntoa((in_addr)(this->remote).sin_addr.s_addr);
      uVar1 = (this->remote).sin_port;
      poVar3 = std::operator<<((ostream *)&std::cout,"[PCKG ERROR] Skipping invalid package from ");
      poVar3 = std::operator<<(poVar3,pcVar4);
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar1 << 8 | uVar1 >> 8);
      poVar3 = std::operator<<(poVar3,". ");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_80);
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(this_00,"Invalid read udp packet");
  __cxa_throw(this_00,&Error::typeinfo,std::exception::~exception);
}

Assistant:

void MultiQuery<REQ, RES>::on_input(Poll &p) {
  socklen_t remln = sizeof(remote);
  int read = recvfrom(fd, &buffer[0], buffer.size(), 0, (struct sockaddr *) &remote, &remln);
  if (read < 0) {
    throw Error("Invalid read udp packet");
  }
  std::string data = buffer.substr(0, read);
  RES dto;
  try {
    dto = dto::unmarshall_facade<RES>(data);
  } catch (Error &e) {
    if (this->error)
      this->error();
    return;
  }
  std::cout << "MultiQuery: received " << dto << std::endl;
  if (dto.header.cmd_seq != this->req.header.cmd_seq) {
    char *s = inet_ntoa(remote.sin_addr);
    uint16_t port = ntohs(remote.sin_port);
    std::cout << "[PCKG ERROR] Skipping invalid package from " << s << ":" << port << ". " << std::endl;
  } else {
    if (this->callback)
      this->callback(dto, remote);
  }
}